

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O1

void __thiscall phoenix_evsa_t::evsa_data_t::~evsa_data_t(evsa_data_t *this)

{
  pointer pcVar1;
  evsa_variable_attributes_t *peVar2;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__evsa_data_t_00185200;
  pcVar1 = (this->m_data_ext)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_data_ext).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_data)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_data).field_2) {
    operator_delete(pcVar1);
  }
  peVar2 = (this->m_attributes)._M_t.
           super___uniq_ptr_impl<phoenix_evsa_t::evsa_variable_attributes_t,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_phoenix_evsa_t::evsa_variable_attributes_t_*,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
           .super__Head_base<0UL,_phoenix_evsa_t::evsa_variable_attributes_t_*,_false>._M_head_impl;
  if (peVar2 != (evsa_variable_attributes_t *)0x0) {
    (**(code **)((long)(peVar2->super_kstruct)._vptr_kstruct + 8))();
  }
  (this->m_attributes)._M_t.
  super___uniq_ptr_impl<phoenix_evsa_t::evsa_variable_attributes_t,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_phoenix_evsa_t::evsa_variable_attributes_t_*,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
  .super__Head_base<0UL,_phoenix_evsa_t::evsa_variable_attributes_t_*,_false>._M_head_impl =
       (evsa_variable_attributes_t *)0x0;
  return;
}

Assistant:

phoenix_evsa_t::evsa_data_t::~evsa_data_t() {
    _clean_up();
}